

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void __thiscall
ByteCodeGenerator::EmitGlobalFncDeclInit
          (ByteCodeGenerator *this,RegSlot rhsLocation,PropertyId propertyId,FuncInfo *funcInfo)

{
  uint propertyIdIndex;
  
  if ((this->flags & 0x400) == 0) {
    EmitPatchableRootProperty(this,InitRootFld,rhsLocation,propertyId,false,true,funcInfo);
    return;
  }
  propertyIdIndex = FuncInfo::FindOrAddReferencedPropertyId(funcInfo,propertyId);
  Js::ByteCodeWriter::ScopedProperty
            (&this->m_writer,ScopedInitFunc,rhsLocation,propertyIdIndex,false);
  return;
}

Assistant:

void ByteCodeGenerator::EmitGlobalFncDeclInit(Js::RegSlot rhsLocation, Js::PropertyId propertyId, FuncInfo * funcInfo)
{
    // Note: declared variables and assignments in the global function go to the root object directly.
    if (this->flags & fscrEval)
    {
        // Func decl's always get their init values before any use, so we don't pre-initialize the property to undef.
        // That means that we have to use ScopedInitFld so that we initialize the property on the right instance
        // even if the instance doesn't have the property yet (i.e., collapse the init-to-undef and the store
        // into one operation). See WOOB 1121763 and 1120973.
        this->m_writer.ScopedProperty(Js::OpCode::ScopedInitFunc, rhsLocation,
            funcInfo->FindOrAddReferencedPropertyId(propertyId));
    }
    else
    {
        this->EmitPatchableRootProperty(Js::OpCode::InitRootFld, rhsLocation, propertyId, false, true, funcInfo);
    }
}